

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

int raplcap_init(raplcap *rc)

{
  uint32_t cpu_model;
  int iVar1;
  raplcap_msr_ctx *ctx;
  raplcap_msr_zone_cfg *ctx_00;
  int *piVar2;
  int iVar3;
  raplcap *rc_00;
  uint32_t n_pkg;
  uint64_t msrval;
  uint32_t n_die;
  uint32_t local_34;
  uint64_t local_30;
  uint32_t local_24;
  
  rc_00 = &rc_default;
  if (rc != (raplcap *)0x0) {
    rc_00 = rc;
  }
  cpu_model = msr_get_supported_cpu_model();
  if (cpu_model == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x5f;
    iVar3 = -1;
  }
  else {
    ctx = (raplcap_msr_ctx *)malloc(0x40);
    iVar3 = -1;
    if (ctx != (raplcap_msr_ctx *)0x0) {
      ctx_00 = (raplcap_msr_zone_cfg *)msr_sys_init(&local_34,&local_24);
      ctx[1].cfg = ctx_00;
      if (ctx_00 == (raplcap_msr_zone_cfg *)0x0) {
        free(ctx);
      }
      else {
        rc_00->nsockets = local_34;
        rc_00->state = ctx;
        iVar1 = msr_sys_read((raplcap_msr_sys_ctx *)ctx_00,&local_30,0,0,0x606);
        if (iVar1 == 0) {
          msr_get_context(ctx,cpu_model,local_30);
          iVar3 = 0;
        }
        else {
          piVar2 = __errno_location();
          iVar1 = *piVar2;
          raplcap_destroy(rc_00);
          *piVar2 = iVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int raplcap_init(raplcap* rc) {
  if (rc == NULL) {
    rc = &rc_default;
  }
  raplcap_msr* state;
  uint64_t msrval;
  uint32_t cpu_model;
  uint32_t n_pkg;
  uint32_t n_die;
  int err_save;
  // check that we recognize the CPU
  if ((cpu_model = msr_get_supported_cpu_model()) == 0) {
    errno = ENOTSUP;
    return -1;
  }
  if ((state = malloc(sizeof(*state))) == NULL) {
    return -1;
  }
  if ((state->sys = msr_sys_init(&n_pkg, &n_die)) == NULL) {
    free(state);
    return -1;
  }
  rc->nsockets = n_pkg;
  rc->state = state;
  if (msr_sys_read(state->sys, &msrval, 0, 0, MSR_RAPL_POWER_UNIT)) {
    err_save = errno;
    raplcap_destroy(rc);
    errno = err_save;
    return -1;
  }
  // now populate context with unit conversions and function pointers
  msr_get_context(&state->ctx, cpu_model, msrval);
  raplcap_log(DEBUG, "raplcap_init: Initialized\n");
  return 0;
}